

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderparser.cpp
# Opt level: O3

bool ShaderParserParseRenderPass
               (string *prev_line,string *line,uint32_t current_char,uint32_t line_number,
               FErrorReport *report_error,RenderPass *pass)

{
  char *pcVar1;
  int iVar2;
  undefined8 uVar3;
  bool bVar4;
  uint32_t width;
  uint32_t height;
  string args;
  char input [64];
  char output [64];
  uint32_t local_110;
  uint32_t local_10c;
  uint32_t local_108;
  uint32_t local_104;
  _Any_data *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  long *local_d8 [2];
  long local_c8 [2];
  char local_b8 [64];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_b8[0x30] = '\0';
  local_b8[0x31] = '\0';
  local_b8[0x32] = '\0';
  local_b8[0x33] = '\0';
  local_b8[0x34] = '\0';
  local_b8[0x35] = '\0';
  local_b8[0x36] = '\0';
  local_b8[0x37] = '\0';
  local_b8[0x38] = '\0';
  local_b8[0x39] = '\0';
  local_b8[0x3a] = '\0';
  local_b8[0x3b] = '\0';
  local_b8[0x3c] = '\0';
  local_b8[0x3d] = '\0';
  local_b8[0x3e] = '\0';
  local_b8[0x3f] = '\0';
  local_b8[0x20] = '\0';
  local_b8[0x21] = '\0';
  local_b8[0x22] = '\0';
  local_b8[0x23] = '\0';
  local_b8[0x24] = '\0';
  local_b8[0x25] = '\0';
  local_b8[0x26] = '\0';
  local_b8[0x27] = '\0';
  local_b8[0x28] = '\0';
  local_b8[0x29] = '\0';
  local_b8[0x2a] = '\0';
  local_b8[0x2b] = '\0';
  local_b8[0x2c] = '\0';
  local_b8[0x2d] = '\0';
  local_b8[0x2e] = '\0';
  local_b8[0x2f] = '\0';
  local_b8[0x10] = '\0';
  local_b8[0x11] = '\0';
  local_b8[0x12] = '\0';
  local_b8[0x13] = '\0';
  local_b8[0x14] = '\0';
  local_b8[0x15] = '\0';
  local_b8[0x16] = '\0';
  local_b8[0x17] = '\0';
  local_b8[0x18] = '\0';
  local_b8[0x19] = '\0';
  local_b8[0x1a] = '\0';
  local_b8[0x1b] = '\0';
  local_b8[0x1c] = '\0';
  local_b8[0x1d] = '\0';
  local_b8[0x1e] = '\0';
  local_b8[0x1f] = '\0';
  local_b8[0] = '\0';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_b8[4] = '\0';
  local_b8[5] = '\0';
  local_b8[6] = '\0';
  local_b8[7] = '\0';
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_110 = 0;
  local_10c = 0;
  local_108 = line_number;
  local_100 = (_Any_data *)report_error;
  std::__cxx11::string::substr((ulong)local_d8,(ulong)prev_line);
  iVar2 = __isoc99_sscanf(local_d8[0],"(%[^,], %[^,], %d, %d)",&local_78,local_b8,&local_110,
                          &local_10c);
  if (iVar2 != 4) {
    local_10c = 0;
    local_110 = 0;
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b8[8] = '\0';
    local_b8[9] = '\0';
    local_b8[10] = '\0';
    local_b8[0xb] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8[0x14] = '\0';
    local_b8[0x15] = '\0';
    local_b8[0x16] = '\0';
    local_b8[0x17] = '\0';
    local_b8[0x18] = '\0';
    local_b8[0x19] = '\0';
    local_b8[0x1a] = '\0';
    local_b8[0x1b] = '\0';
    local_b8[0x1c] = '\0';
    local_b8[0x1d] = '\0';
    local_b8[0x1e] = '\0';
    local_b8[0x1f] = '\0';
    local_b8[0x20] = '\0';
    local_b8[0x21] = '\0';
    local_b8[0x22] = '\0';
    local_b8[0x23] = '\0';
    local_b8[0x24] = '\0';
    local_b8[0x25] = '\0';
    local_b8[0x26] = '\0';
    local_b8[0x27] = '\0';
    local_b8[0x28] = '\0';
    local_b8[0x29] = '\0';
    local_b8[0x2a] = '\0';
    local_b8[0x2b] = '\0';
    local_b8[0x2c] = '\0';
    local_b8[0x2d] = '\0';
    local_b8[0x2e] = '\0';
    local_b8[0x2f] = '\0';
    local_b8[0x30] = '\0';
    local_b8[0x31] = '\0';
    local_b8[0x32] = '\0';
    local_b8[0x33] = '\0';
    local_b8[0x34] = '\0';
    local_b8[0x35] = '\0';
    local_b8[0x36] = '\0';
    local_b8[0x37] = '\0';
    local_b8[0x38] = '\0';
    local_b8[0x39] = '\0';
    local_b8[0x3a] = '\0';
    local_b8[0x3b] = '\0';
    local_b8[0x3c] = '\0';
    local_b8[0x3d] = '\0';
    local_b8[0x3e] = '\0';
    local_b8[0x3f] = '\0';
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    iVar2 = __isoc99_sscanf(local_d8[0]);
    if (iVar2 != 3) {
      local_10c = 0;
      local_110 = 0;
      local_b8[0] = '\0';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_b8[8] = '\0';
      local_b8[9] = '\0';
      local_b8[10] = '\0';
      local_b8[0xb] = '\0';
      local_b8[0xc] = '\0';
      local_b8[0xd] = '\0';
      local_b8[0xe] = '\0';
      local_b8[0xf] = '\0';
      local_b8[0x10] = '\0';
      local_b8[0x11] = '\0';
      local_b8[0x12] = '\0';
      local_b8[0x13] = '\0';
      local_b8[0x14] = '\0';
      local_b8[0x15] = '\0';
      local_b8[0x16] = '\0';
      local_b8[0x17] = '\0';
      local_b8[0x18] = '\0';
      local_b8[0x19] = '\0';
      local_b8[0x1a] = '\0';
      local_b8[0x1b] = '\0';
      local_b8[0x1c] = '\0';
      local_b8[0x1d] = '\0';
      local_b8[0x1e] = '\0';
      local_b8[0x1f] = '\0';
      local_b8[0x20] = '\0';
      local_b8[0x21] = '\0';
      local_b8[0x22] = '\0';
      local_b8[0x23] = '\0';
      local_b8[0x24] = '\0';
      local_b8[0x25] = '\0';
      local_b8[0x26] = '\0';
      local_b8[0x27] = '\0';
      local_b8[0x28] = '\0';
      local_b8[0x29] = '\0';
      local_b8[0x2a] = '\0';
      local_b8[0x2b] = '\0';
      local_b8[0x2c] = '\0';
      local_b8[0x2d] = '\0';
      local_b8[0x2e] = '\0';
      local_b8[0x2f] = '\0';
      local_b8[0x30] = '\0';
      local_b8[0x31] = '\0';
      local_b8[0x32] = '\0';
      local_b8[0x33] = '\0';
      local_b8[0x34] = '\0';
      local_b8[0x35] = '\0';
      local_b8[0x36] = '\0';
      local_b8[0x37] = '\0';
      local_b8[0x38] = '\0';
      local_b8[0x39] = '\0';
      local_b8[0x3a] = '\0';
      local_b8[0x3b] = '\0';
      local_b8[0x3c] = '\0';
      local_b8[0x3d] = '\0';
      local_b8[0x3e] = '\0';
      local_b8[0x3f] = '\0';
      local_78 = 0;
      uStack_70 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_48 = 0;
      uStack_40 = 0;
      iVar2 = __isoc99_sscanf(local_d8[0]);
      if (iVar2 != 2) {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,
                   "Render pass format should be @pass(output, input, width, height), @pass(output, input) or @pass(output, width, height)"
                   ,"");
        local_104 = local_108;
        if (*(long *)(local_100 + 1) == 0) {
          uVar3 = std::__throw_bad_function_call();
          if (local_d8[0] != local_c8) {
            operator_delete(local_d8[0],local_c8[0] + 1);
          }
          _Unwind_Resume(uVar3);
        }
        (**(code **)(local_100->_M_pod_data + 0x18))(local_100,&local_f8,&local_104);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        bVar4 = false;
        goto LAB_00118d38;
      }
    }
  }
  pcVar1 = (char *)(pass->Input)._M_string_length;
  strlen(local_b8);
  std::__cxx11::string::_M_replace((ulong)&pass->Input,0,pcVar1,(ulong)local_b8);
  pcVar1 = (char *)(pass->Output)._M_string_length;
  strlen((char *)&local_78);
  std::__cxx11::string::_M_replace((ulong)&pass->Output,0,pcVar1,(ulong)&local_78);
  pass->Width = local_110;
  pass->Height = local_10c;
  iVar2 = std::__cxx11::string::compare((char *)&pass->Output);
  bVar4 = true;
  if (iVar2 == 0) {
    pass->IsMain = true;
  }
LAB_00118d38:
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  return bVar4;
}

Assistant:

bool ShaderParserParseRenderPass(const std::string& prev_line, const std::string& line, uint32_t current_char, uint32_t line_number, FErrorReport report_error, RenderPass& pass) {
    char input[64] = {0};
    char output[64] = {0};

    uint32_t width = 0;
    uint32_t height = 0;

    std::string args = prev_line.substr(current_char + 5, std::string::npos);

    int scanned = sscanf(args.c_str(), "(%[^,], %[^,], %d, %d)", output, input, &width, &height);
    if (scanned != 4) {
        width = height = 0;

        memset(input, 0x0, sizeof(input));
        memset(output, 0x0, sizeof(output));

        scanned = sscanf(args.c_str(), "(%[^,], %d, %d)", output, &width, &height);

        if (scanned != 3) {
            width = height = 0;

            memset(input, 0x0, sizeof(input));
            memset(output, 0x0, sizeof(output));

            scanned = sscanf(args.c_str(), "(%[^,], %[^)])", output, input);

            if (scanned != 2) {
                report_error("Render pass format should be @pass(output, input, width, height), @pass(output, input) or @pass(output, width, height)", line_number);
                return false;
            }
        }
    }

    pass.Input = input;
    pass.Output = output;
    pass.Width = width;
    pass.Height = height;

    if (pass.Output == "main") {
        pass.IsMain = true;
    }

    return true;
}